

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

sunrealtype N_VWSqrSumLocal_ManyVector(N_Vector x,N_Vector w)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  sunrealtype sVar5;
  
  plVar1 = (long *)x->content;
  if (*plVar1 < 1) {
    sVar5 = 0.0;
  }
  else {
    sVar5 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = (double)N_VWrmsNorm(*(undefined8 *)(plVar1[2] + lVar3 * 8),
                                  *(undefined8 *)(*(long *)((long)w->content + 0x10) + lVar3 * 8));
      lVar2 = N_VGetLength(*(undefined8 *)(*(long *)((long)x->content + 0x10) + lVar3 * 8));
      sVar5 = sVar5 + (double)lVar2 * dVar4 * dVar4;
      lVar3 = lVar3 + 1;
      plVar1 = (long *)x->content;
    } while (lVar3 < *plVar1);
  }
  return sVar5;
}

Assistant:

sunrealtype MVAPPEND(N_VWSqrSumLocal)(N_Vector x, N_Vector w)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, N;
  sunrealtype sum, contrib;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  int rank;
#endif

  /* initialize output*/
  sum = ZERO;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
#ifdef MANYVECTOR_BUILD_WITH_MPI

    /* check for nvwsqrsumlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvwsqrsumlocal)
    {
      sum += N_VWSqrSumLocal(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNoRet();

      /* otherwise, call nvwrmsnorm, and accumulate to overall sum on root task */
    }
    else
    {
      contrib = N_VWrmsNorm(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNoRet();

      /* get this task's rank in subvector communicator (note: serial
         subvectors will result in rank==0) */
      rank = SubvectorMPIRank(MANYVECTOR_SUBVEC(x, i));
      if (rank < 0) { return (ZERO); }
      if (rank == 0)
      {
        N = N_VGetLength(MANYVECTOR_SUBVEC(x, i));
        SUNCheckLastErrNoRet();
        sum += (contrib * contrib * N);
      }
    }

#else

    /* accumulate subvector contribution to overall sum */
    contrib = N_VWrmsNorm(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(w, i));
    SUNCheckLastErrNoRet();
    N = N_VGetLength(MANYVECTOR_SUBVEC(x, i));
    SUNCheckLastErrNoRet();
    sum += (contrib * contrib * N);

#endif
  }

  return (sum);
}